

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O1

void tokenize_vartx(ThreadData *td,TX_SIZE tx_size,BLOCK_SIZE plane_bsize,int blk_row,int blk_col,
                   int block,int plane,void *arg)

{
  byte bVar1;
  BLOCK_SIZE plane_bsize_00;
  int iVar2;
  int iVar3;
  MB_MODE_INFO *pMVar4;
  long lVar5;
  byte bVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  lVar5 = (long)plane;
  uVar10 = CONCAT71(in_register_00000011,plane_bsize) & 0xffffffff;
  uVar12 = (uint)block_size_high[uVar10];
  iVar13 = (td->mb).e_mbd.mb_to_bottom_edge;
  if (iVar13 < 0) {
    uVar12 = (uint)block_size_high[uVar10] +
             (iVar13 >> ((char)(td->mb).e_mbd.plane[lVar5].subsampling_y + 3U & 0x1f));
  }
  uVar7 = (uint)block_size_wide[uVar10];
  iVar13 = (td->mb).e_mbd.mb_to_right_edge;
  if (iVar13 < 0) {
    uVar7 = (uint)block_size_wide[uVar10] +
            (iVar13 >> ((char)(td->mb).e_mbd.plane[lVar5].subsampling_x + 3U & 0x1f));
  }
  iVar13 = ((int)uVar12 >> 2) - blk_row;
  if ((iVar13 != 0 && blk_row <= (int)uVar12 >> 2) &&
     (iVar8 = ((int)uVar7 >> 2) - blk_col, iVar8 != 0 && blk_col <= (int)uVar7 >> 2)) {
    pMVar4 = *(td->mb).e_mbd.mi;
    if (plane == 0) {
      bVar6 = pMVar4->inter_tx_size
              [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar10] & 0x1f)) +
               ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar10] & 0x1f)) <<
               (av1_get_txb_size_index_stride_log2_table[uVar10] & 0x1f))];
    }
    else {
      bVar1 = ""[av1_ss_size_lookup[pMVar4->bsize][(td->mb).e_mbd.plane[lVar5].subsampling_x]
                 [(td->mb).e_mbd.plane[lVar5].subsampling_y]];
      if (bVar1 < 0x11) {
        bVar6 = 3;
        if ((1 < bVar1 - 0xb) && (bVar1 != 4)) {
          bVar6 = bVar1;
        }
      }
      else if (bVar1 == 0x11) {
        bVar6 = 9;
      }
      else {
        bVar6 = bVar1;
        if (bVar1 == 0x12) {
          bVar6 = 10;
        }
      }
    }
    if ((plane == 0) && (bVar6 != tx_size)) {
      iVar2 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      if (iVar2 < iVar13) {
        iVar13 = iVar2;
      }
      iVar2 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      if (iVar2 < iVar8) {
        iVar8 = iVar2;
      }
      if (0 < iVar13) {
        bVar6 = ""[tx_size];
        iVar2 = tx_size_wide_unit[bVar6];
        iVar3 = tx_size_high_unit[bVar6];
        iVar9 = 0;
        do {
          if (0 < iVar8) {
            iVar11 = 0;
            do {
              tokenize_vartx(td,bVar6,plane_bsize,blk_row + iVar9,blk_col + iVar11,block,0,arg);
              block = block + iVar3 * iVar2;
              iVar11 = iVar11 + iVar2;
            } while (iVar11 < iVar8);
          }
          iVar9 = iVar9 + iVar3;
        } while (iVar9 < iVar13);
      }
    }
    else {
      plane_bsize_00 =
           av1_ss_size_lookup[pMVar4->bsize][(td->mb).e_mbd.plane[lVar5].subsampling_x]
           [(td->mb).e_mbd.plane[lVar5].subsampling_y];
      if (*(char *)((long)arg + 0x14) == '\0') {
        av1_record_txb_context(plane,block,blk_row,blk_col,plane_bsize_00,tx_size,arg);
      }
      else {
        av1_update_and_record_txb_context(plane,block,blk_row,blk_col,plane_bsize_00,tx_size,arg);
      }
    }
  }
  return;
}

Assistant:

static void tokenize_vartx(ThreadData *td, TX_SIZE tx_size,
                           BLOCK_SIZE plane_bsize, int blk_row, int blk_col,
                           int block, int plane, void *arg) {
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];

  if (tx_size == plane_tx_size || plane) {
    plane_bsize =
        get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);

    struct tokenize_b_args *args = arg;
    if (args->allow_update_cdf)
      av1_update_and_record_txb_context(plane, block, blk_row, blk_col,
                                        plane_bsize, tx_size, arg);
    else
      av1_record_txb_context(plane, block, blk_row, blk_col, plane_bsize,
                             tx_size, arg);

  } else {
    // Half the block size in transform block unit.
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsw * bsh;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);

    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        tokenize_vartx(td, sub_txs, plane_bsize, offsetr, offsetc, block, plane,
                       arg);
        block += step;
      }
    }
  }
}